

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

void __thiscall mocker::ir::Builder::operator()(Builder *this,ClassDecl *node)

{
  bool bVar1;
  element_type *node_00;
  undefined1 local_48 [8];
  shared_ptr<mocker::ast::FuncDecl> p;
  shared_ptr<mocker::ast::Declaration> *member;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
  *__range2;
  ClassDecl *node_local;
  Builder *this_local;
  
  __end2 = std::
           vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
           ::begin(&node->members);
  member = (shared_ptr<mocker::ast::Declaration> *)
           std::
           vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
           ::end(&node->members);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::shared_ptr<mocker::ast::Declaration>_*,_std::vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>_>
                                     *)&member), bVar1) {
    p.super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         __gnu_cxx::
         __normal_iterator<const_std::shared_ptr<mocker::ast::Declaration>_*,_std::vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>_>
         ::operator*(&__end2);
    std::dynamic_pointer_cast<mocker::ast::FuncDecl,mocker::ast::Declaration>
              ((shared_ptr<mocker::ast::Declaration> *)local_48);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
    if (bVar1) {
      node_00 = std::
                __shared_ptr_access<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_48);
      visit<mocker::ast::FuncDecl>(this,node_00);
    }
    std::shared_ptr<mocker::ast::FuncDecl>::~shared_ptr
              ((shared_ptr<mocker::ast::FuncDecl> *)local_48);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<mocker::ast::Declaration>_*,_std::vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void Builder::operator()(const ast::ClassDecl &node) const {
  for (auto &member : node.members)
    if (auto p = std::dynamic_pointer_cast<ast::FuncDecl>(member))
      visit(*p);
}